

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O1

string * __thiscall
plot::TerminalInfo::query<void>
          (string *__return_storage_ptr__,TerminalInfo *this,string_view cmd,string_view terminator)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  ssize_t sVar5;
  void *pvVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type *psVar8;
  size_type __n;
  char ch;
  int available;
  termios oldAttrs;
  char local_11d;
  int local_11c;
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  char *local_f8;
  termios local_ec;
  char local_b0;
  int local_ac;
  termios local_a8;
  termios local_6c;
  
  iVar3 = tcgetattr(this->term_,&local_ec);
  if (iVar3 != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_6c.c_lflag = local_ec.c_lflag & 0xfffffff5;
  local_ac = this->term_;
  local_b0 = 0;
  local_a8.c_iflag = local_ec.c_iflag;
  local_a8.c_oflag = local_ec.c_oflag;
  local_a8.c_cc[7] = local_ec.c_cc[7];
  local_a8.c_cc[8] = local_ec.c_cc[8];
  local_a8.c_cc[9] = local_ec.c_cc[9];
  local_a8.c_cc[10] = local_ec.c_cc[10];
  local_a8.c_cc[0xb] = local_ec.c_cc[0xb];
  local_a8.c_cc[0xc] = local_ec.c_cc[0xc];
  local_a8.c_cc[0xd] = local_ec.c_cc[0xd];
  local_a8.c_cc[0xe] = local_ec.c_cc[0xe];
  local_a8.c_cc[0xf] = local_ec.c_cc[0xf];
  local_a8.c_cc[0x10] = local_ec.c_cc[0x10];
  local_a8.c_cc[0x11] = local_ec.c_cc[0x11];
  local_a8.c_cc[0x12] = local_ec.c_cc[0x12];
  local_a8.c_cc[0x13] = local_ec.c_cc[0x13];
  local_a8.c_cc[0x14] = local_ec.c_cc[0x14];
  local_a8.c_cc[0x15] = local_ec.c_cc[0x15];
  local_a8.c_cc[0x16] = local_ec.c_cc[0x16];
  local_6c.c_iflag = local_ec.c_iflag;
  local_6c.c_oflag = local_ec.c_oflag;
  local_6c.c_cflag = local_ec.c_cflag;
  local_6c.c_line = local_ec.c_line;
  local_6c.c_cc[0] = local_ec.c_cc[0];
  local_6c.c_cc[1] = local_ec.c_cc[1];
  local_6c.c_cc[2] = local_ec.c_cc[2];
  local_6c.c_cc[3] = local_ec.c_cc[3];
  local_6c.c_cc[4] = local_ec.c_cc[4];
  local_6c.c_cc[5] = '\0';
  local_6c.c_cc[6] = '\0';
  local_6c.c_ospeed = local_ec.c_ospeed;
  local_6c.c_cc[7] = local_ec.c_cc[7];
  local_6c.c_cc[8] = local_ec.c_cc[8];
  local_6c.c_cc[9] = local_ec.c_cc[9];
  local_6c.c_cc[10] = local_ec.c_cc[10];
  local_6c.c_cc[0xb] = local_ec.c_cc[0xb];
  local_6c.c_cc[0xc] = local_ec.c_cc[0xc];
  local_6c.c_cc[0xd] = local_ec.c_cc[0xd];
  local_6c.c_cc[0xe] = local_ec.c_cc[0xe];
  local_6c.c_cc[0xf] = local_ec.c_cc[0xf];
  local_6c.c_cc[0x10] = local_ec.c_cc[0x10];
  local_6c.c_cc[0x11] = local_ec.c_cc[0x11];
  local_6c.c_cc[0x12] = local_ec.c_cc[0x12];
  local_6c.c_cc[0x13] = local_ec.c_cc[0x13];
  local_6c.c_cc[0x14] = local_ec.c_cc[0x14];
  local_6c.c_cc[0x15] = local_ec.c_cc[0x15];
  local_6c.c_cc[0x16] = local_ec.c_cc[0x16];
  local_f8 = terminator._M_str;
  iVar3 = tcsetattr(local_ac,0,&local_6c);
  local_b0 = iVar3 == 0;
  if (((((bool)local_b0) && (iVar3 = tcdrain(this->term_), iVar3 == 0)) &&
      (iVar3 = tcflush(this->term_,0), iVar3 == 0)) &&
     (sVar4 = write(this->term_,cmd._M_str,cmd._M_len), sVar4 == cmd._M_len)) {
    local_118._M_p = (pointer)0x64;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&local_118);
    local_11c = 0;
    iVar3 = ioctl(this->term_,0x541b);
    if (iVar3 == 0) {
      local_118._M_p = (pointer)&local_108;
      local_110 = 0;
      local_108._M_local_buf[0] = '\0';
      if (local_11c != 0) {
        do {
          std::__cxx11::string::reserve((ulong)&local_118);
          if (0 < local_11c) {
            do {
              local_11d = '\0';
              sVar5 = read(this->term_,&local_11d,1);
              if (sVar5 != 1) {
                paVar7 = &__return_storage_ptr__->field_2;
                (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar7;
                psVar8 = &__return_storage_ptr__->_M_string_length;
LAB_00107870:
                *psVar8 = 0;
                paVar7->_M_local_buf[0] = '\0';
                goto LAB_0010787a;
              }
              if (local_110 != 0 || local_11d == '\x1b') {
                iVar3 = (int)local_11d;
                std::__cxx11::string::_M_replace_aux((ulong)&local_118,local_110,0,'\x01');
                pcVar2 = local_f8;
                if ((terminator._M_len != 0) &&
                   (pvVar6 = memchr(local_f8,iVar3,terminator._M_len),
                   (long)pvVar6 - (long)pcVar2 != -1 && pvVar6 != (void *)0x0)) {
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  paVar7 = &local_108;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_p == paVar7) {
                    (__return_storage_ptr__->field_2)._M_allocated_capacity =
                         CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]);
                    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_108._8_8_;
                  }
                  else {
                    (__return_storage_ptr__->_M_dataplus)._M_p = local_118._M_p;
                    (__return_storage_ptr__->field_2)._M_allocated_capacity =
                         CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]);
                  }
                  psVar8 = &local_110;
                  __return_storage_ptr__->_M_string_length = local_110;
                  local_118._M_p = (pointer)paVar7;
                  goto LAB_00107870;
                }
              }
              iVar3 = local_11c + -1;
              bVar1 = 1 < local_11c;
              local_11c = iVar3;
            } while (bVar1);
          }
        } while (((local_110 == 0) || (iVar3 = ioctl(this->term_,0x541b,&local_11c), iVar3 == 0)) &&
                (local_11c != 0));
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0010787a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_p != &local_108) {
        operator_delete(local_118._M_p,
                        CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) +
                        1);
      }
      goto LAB_001076cb;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_001076cb:
  if (local_b0 == '\x01') {
    tcsetattr(local_ac,0,&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TerminalInfo::query(string_view cmd, string_view terminator) {
    struct termios oldAttrs;
    if (tcgetattr(term_, &oldAttrs))
        return std::string();

    struct termios newAttrs = oldAttrs;
    newAttrs.c_lflag &= ~(ECHO | ICANON);
    newAttrs.c_cc[VMIN] = 0;
    newAttrs.c_cc[VTIME] = 0;

    detail::tcsetattr_guard guard(term_, oldAttrs, newAttrs);
    if (!guard.set())
        return std::string();

    if (tcdrain(term_))
        return std::string();

    if (tcflush(term_, TCIFLUSH))
        return std::string();

    if (std::size_t(write(term_, cmd.data(), cmd.size())) != cmd.size())
        return std::string();

    // FIXME: This won't be enough for remote terminals (e.g. SSH)
    using namespace std::chrono_literals;
    std::this_thread::sleep_for(100ms);

    int available = 0;
    if (ioctl(term_, FIONREAD, &available))
        return std::string();

    std::string result;

    while (available) {
        result.reserve(result.size() + available);

        for (; available > 0; --available) {
            char ch = '\0';
            if (read(term_, &ch, 1) != 1)
                return std::string();

            if (!result.empty() || ch == '\x1b') {
                result.append(1, ch);
                if (terminator.find(ch) != string_view::npos)
                    return result;
            }
        }

        // If we found an escape character but no terminator, continue reading
        if (!result.empty())
            if (ioctl(term_, FIONREAD, &available))
                return std::string();
    }

    return std::string();
}